

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O2

void __thiscall
Imf_2_5::CompositeDeepScanLine::setFrameBuffer(CompositeDeepScanLine *this,FrameBuffer *fr)

{
  Data *pDVar1;
  bool bVar2;
  const_iterator cVar3;
  ConstIterator CVar4;
  ConstIterator tmp;
  undefined4 local_54;
  string name;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->_Data->_channels,3);
  std::__cxx11::string::assign
            ((char *)(this->_Data->_channels).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::assign
            ((char *)((this->_Data->_channels).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1));
  std::__cxx11::string::assign
            ((char *)((this->_Data->_channels).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 2));
  std::vector<int,_std::allocator<int>_>::resize(&this->_Data->_bufferMap,0);
  cVar3._M_node = (_Base_ptr)FrameBuffer::begin(fr);
  for (; CVar4 = FrameBuffer::end(fr), (const_iterator)cVar3._M_node != CVar4._i._M_node;
      cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,(char *)(cVar3._M_node + 1),(allocator<char> *)&local_54);
    bVar2 = std::operator==(&name,"ZBack");
    if (bVar2) {
      local_54 = 1;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (&this->_Data->_bufferMap,(int *)&local_54);
    }
    else {
      bVar2 = std::operator==(&name,"Z");
      if (bVar2) {
        local_54 = 0;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&this->_Data->_bufferMap,(int *)&local_54);
      }
      else {
        bVar2 = std::operator==(&name,"A");
        pDVar1 = this->_Data;
        if (bVar2) {
          local_54 = 2;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (&pDVar1->_bufferMap,(int *)&local_54);
        }
        else {
          local_54 = (undefined4)
                     ((ulong)((long)(pDVar1->_channels).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pDVar1->_channels).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (&pDVar1->_bufferMap,(int *)&local_54);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->_Data->_channels,&name);
        }
      }
    }
    std::__cxx11::string::~string((string *)&name);
  }
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
  ::operator=((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
               *)&this->_Data->_outputFrameBuffer,
              (_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
               *)fr);
  return;
}

Assistant:

void
CompositeDeepScanLine::setFrameBuffer(const FrameBuffer& fr)
{
    
    //
    // count channels; build map between channels in frame buffer
    // and channels in internal buffers
    //
    
    _Data->_channels.resize(3);
    _Data->_channels[0]="Z";
    _Data->_channels[1]=_Data->_zback ? "ZBack" : "Z";
    _Data->_channels[2]="A";
    _Data->_bufferMap.resize(0);
    
    for(FrameBuffer::ConstIterator q=fr.begin();q!=fr.end();q++)
    {
        string name(q.name());
        if(name=="ZBack")
        {
            _Data->_bufferMap.push_back(1);
        }else if(name=="Z")
        {
            _Data->_bufferMap.push_back(0);
        }else if(name=="A")
        {
            _Data->_bufferMap.push_back(2);
        }else{
            _Data->_bufferMap.push_back(_Data->_channels.size());
            _Data->_channels.push_back(name);
        }
    }
    
  _Data->_outputFrameBuffer=fr;
}